

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  char cVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong *puVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar44;
  int iVar45;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar48 [16];
  vint4 bi_3;
  undefined1 auVar49 [16];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 ai_1;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 1.0000004)));
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  puVar20 = local_7d0;
LAB_01cdfe5a:
  puVar19 = puVar20;
  if (puVar19 == &local_7d8) {
LAB_01ce02e9:
    return puVar19 != &local_7d8;
  }
  puVar20 = puVar19 + -1;
  uVar16 = puVar19[-1];
  do {
    fVar4 = *(float *)(ray + k * 4 + 0x70);
    auVar47._4_4_ = fVar4;
    auVar47._0_4_ = fVar4;
    auVar47._8_4_ = fVar4;
    auVar47._12_4_ = fVar4;
    auVar34 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar47);
    auVar34._4_4_ = auVar34._0_4_;
    auVar34._8_4_ = auVar34._0_4_;
    auVar34._12_4_ = auVar34._0_4_;
    do {
      if ((uVar16 & 8) != 0) {
        cVar12 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar12 == '\0') goto LAB_01cdfe5a;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_01ce02e9;
      }
      uVar14 = (uint)uVar16 & 7;
      uVar13 = uVar16 & 0xfffffffffffffff0;
      if (uVar14 == 3) {
        auVar36 = *(undefined1 (*) [16])(uVar13 + 0x80);
        auVar35 = *(undefined1 (*) [16])(uVar13 + 0x90);
        auVar37 = *(undefined1 (*) [16])(uVar13 + 0xa0);
        auVar56._0_4_ = fVar3 * auVar36._0_4_;
        auVar56._4_4_ = fVar3 * auVar36._4_4_;
        auVar56._8_4_ = fVar3 * auVar36._8_4_;
        auVar56._12_4_ = fVar3 * auVar36._12_4_;
        auVar41._0_4_ = fVar3 * auVar35._0_4_;
        auVar41._4_4_ = fVar3 * auVar35._4_4_;
        auVar41._8_4_ = fVar3 * auVar35._8_4_;
        auVar41._12_4_ = fVar3 * auVar35._12_4_;
        auVar51._0_4_ = fVar3 * auVar37._0_4_;
        auVar51._4_4_ = fVar3 * auVar37._4_4_;
        auVar51._8_4_ = fVar3 * auVar37._8_4_;
        auVar51._12_4_ = fVar3 * auVar37._12_4_;
        auVar43._4_4_ = uVar2;
        auVar43._0_4_ = uVar2;
        auVar43._8_4_ = uVar2;
        auVar43._12_4_ = uVar2;
        auVar38 = vfmadd231ps_fma(auVar56,auVar43,*(undefined1 (*) [16])(uVar13 + 0x50));
        auVar42 = vfmadd231ps_fma(auVar41,auVar43,*(undefined1 (*) [16])(uVar13 + 0x60));
        auVar43 = vfmadd231ps_fma(auVar51,auVar43,*(undefined1 (*) [16])(uVar13 + 0x70));
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        auVar38 = vfmadd231ps_fma(auVar38,auVar39,*(undefined1 (*) [16])(uVar13 + 0x20));
        auVar42 = vfmadd231ps_fma(auVar42,auVar39,*(undefined1 (*) [16])(uVar13 + 0x30));
        auVar43 = vfmadd231ps_fma(auVar43,auVar39,*(undefined1 (*) [16])(uVar13 + 0x40));
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar40 = vandps_avx512vl(auVar38,auVar39);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar40,auVar41,1);
        bVar7 = (bool)((byte)uVar16 & 1);
        iVar23 = auVar41._0_4_;
        auVar40._0_4_ = (uint)bVar7 * iVar23 | (uint)!bVar7 * auVar38._0_4_;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        iVar44 = auVar41._4_4_;
        auVar40._4_4_ = (uint)bVar7 * iVar44 | (uint)!bVar7 * auVar38._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        iVar45 = auVar41._8_4_;
        iVar46 = auVar41._12_4_;
        auVar40._8_4_ = (uint)bVar7 * iVar45 | (uint)!bVar7 * auVar38._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar7 * iVar46 | (uint)!bVar7 * auVar38._12_4_;
        auVar38 = vandps_avx512vl(auVar42,auVar39);
        uVar16 = vcmpps_avx512vl(auVar38,auVar41,1);
        bVar7 = (bool)((byte)uVar16 & 1);
        auVar38._0_4_ = (uint)bVar7 * iVar23 | (uint)!bVar7 * auVar42._0_4_;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar7 * iVar44 | (uint)!bVar7 * auVar42._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar7 * iVar45 | (uint)!bVar7 * auVar42._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar7 * iVar46 | (uint)!bVar7 * auVar42._12_4_;
        auVar42 = vandps_avx512vl(auVar43,auVar39);
        uVar16 = vcmpps_avx512vl(auVar42,auVar41,1);
        bVar7 = (bool)((byte)uVar16 & 1);
        auVar42._0_4_ = (uint)bVar7 * iVar23 | (uint)!bVar7 * auVar43._0_4_;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar7 * iVar44 | (uint)!bVar7 * auVar43._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar7 * iVar45 | (uint)!bVar7 * auVar43._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar7 * iVar46 | (uint)!bVar7 * auVar43._12_4_;
        auVar43 = vrcp14ps_avx512vl(auVar40);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar39 = vfnmadd213ps_avx512vl(auVar40,auVar43,auVar41);
        auVar39 = vfmadd132ps_fma(auVar39,auVar43,auVar43);
        auVar43 = vrcp14ps_avx512vl(auVar38);
        auVar38 = vfnmadd213ps_avx512vl(auVar38,auVar43,auVar41);
        auVar40 = vfmadd132ps_fma(auVar38,auVar43,auVar43);
        auVar38 = vrcp14ps_avx512vl(auVar42);
        auVar42 = vfnmadd213ps_avx512vl(auVar42,auVar38,auVar41);
        auVar41 = vfmadd132ps_fma(auVar42,auVar38,auVar38);
        auVar36 = vfmadd213ps_avx512vl(auVar36,auVar25,*(undefined1 (*) [16])(uVar13 + 0xb0));
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar24,*(undefined1 (*) [16])(uVar13 + 0x50));
        auVar35 = vfmadd213ps_avx512vl(auVar35,auVar25,*(undefined1 (*) [16])(uVar13 + 0xc0));
        auVar38 = vfmadd231ps_avx512vl(auVar35,auVar24,*(undefined1 (*) [16])(uVar13 + 0x60));
        auVar35 = vfmadd213ps_avx512vl(auVar37,auVar25,*(undefined1 (*) [16])(uVar13 + 0xd0));
        auVar37 = vfmadd231ps_avx512vl(auVar35,auVar24,*(undefined1 (*) [16])(uVar13 + 0x70));
        auVar61._0_4_ = fVar4 * *(float *)(uVar13 + 0xe0);
        auVar61._4_4_ = fVar4 * *(float *)(uVar13 + 0xe4);
        auVar61._8_4_ = fVar4 * *(float *)(uVar13 + 0xe8);
        auVar61._12_4_ = fVar4 * *(float *)(uVar13 + 0xec);
        auVar35 = vfmadd231ps_fma(auVar36,auVar62,*(undefined1 (*) [16])(uVar13 + 0x20));
        auVar60._0_4_ = fVar4 * *(float *)(uVar13 + 0xf0);
        auVar60._4_4_ = fVar4 * *(float *)(uVar13 + 0xf4);
        auVar60._8_4_ = fVar4 * *(float *)(uVar13 + 0xf8);
        auVar60._12_4_ = fVar4 * *(float *)(uVar13 + 0xfc);
        auVar38 = vfmadd231ps_fma(auVar38,auVar62,*(undefined1 (*) [16])(uVar13 + 0x30));
        auVar58._0_4_ = fVar4 * *(float *)(uVar13 + 0x100);
        auVar58._4_4_ = fVar4 * *(float *)(uVar13 + 0x104);
        auVar58._8_4_ = fVar4 * *(float *)(uVar13 + 0x108);
        auVar58._12_4_ = fVar4 * *(float *)(uVar13 + 0x10c);
        auVar42 = ZEXT816(0) << 0x20;
        auVar36 = vfmadd231ps_fma(auVar61,auVar34,auVar42);
        auVar43 = vfmadd231ps_fma(auVar37,auVar62,*(undefined1 (*) [16])(uVar13 + 0x40));
        auVar37 = vfmadd231ps_fma(auVar60,auVar34,auVar42);
        auVar52._0_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x110);
        auVar52._4_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x114);
        auVar52._8_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x118);
        auVar52._12_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x11c);
        auVar36 = vsubps_avx(auVar36,auVar35);
        auVar35 = vsubps_avx(auVar52,auVar35);
        auVar42 = vfmadd231ps_fma(auVar58,auVar34,auVar42);
        auVar53._0_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x120);
        auVar53._4_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x124);
        auVar53._8_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x128);
        auVar53._12_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 300);
        auVar37 = vsubps_avx(auVar37,auVar38);
        auVar38 = vsubps_avx(auVar53,auVar38);
        auVar54._0_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x130);
        auVar54._4_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x134);
        auVar54._8_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x138);
        auVar54._12_4_ = auVar34._0_4_ + fVar4 * *(float *)(uVar13 + 0x13c);
        auVar42 = vsubps_avx(auVar42,auVar43);
        auVar43 = vsubps_avx(auVar54,auVar43);
        auVar55._0_4_ = auVar36._0_4_ * auVar39._0_4_;
        auVar55._4_4_ = auVar36._4_4_ * auVar39._4_4_;
        auVar55._8_4_ = auVar36._8_4_ * auVar39._8_4_;
        auVar55._12_4_ = auVar36._12_4_ * auVar39._12_4_;
        auVar50._0_4_ = auVar39._0_4_ * auVar35._0_4_;
        auVar50._4_4_ = auVar39._4_4_ * auVar35._4_4_;
        auVar50._8_4_ = auVar39._8_4_ * auVar35._8_4_;
        auVar50._12_4_ = auVar39._12_4_ * auVar35._12_4_;
        auVar57._0_4_ = auVar37._0_4_ * auVar40._0_4_;
        auVar57._4_4_ = auVar37._4_4_ * auVar40._4_4_;
        auVar57._8_4_ = auVar37._8_4_ * auVar40._8_4_;
        auVar57._12_4_ = auVar37._12_4_ * auVar40._12_4_;
        auVar59._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar59._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar59._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar59._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar49._0_4_ = auVar38._0_4_ * auVar40._0_4_;
        auVar49._4_4_ = auVar38._4_4_ * auVar40._4_4_;
        auVar49._8_4_ = auVar38._8_4_ * auVar40._8_4_;
        auVar49._12_4_ = auVar38._12_4_ * auVar40._12_4_;
        auVar48._0_4_ = auVar43._0_4_ * auVar41._0_4_;
        auVar48._4_4_ = auVar43._4_4_ * auVar41._4_4_;
        auVar48._8_4_ = auVar43._8_4_ * auVar41._8_4_;
        auVar48._12_4_ = auVar43._12_4_ * auVar41._12_4_;
        auVar36 = vpminsd_avx(auVar57,auVar49);
        auVar35 = vpminsd_avx(auVar59,auVar48);
        auVar36 = vmaxps_avx(auVar36,auVar35);
        auVar42 = vpminsd_avx(auVar55,auVar50);
        auVar37 = vpmaxsd_avx(auVar55,auVar50);
        auVar35 = vpmaxsd_avx(auVar57,auVar49);
        auVar38 = vpmaxsd_avx(auVar59,auVar48);
        auVar35 = vminps_avx(auVar35,auVar38);
        auVar38 = vmaxps_avx512vl(auVar32,auVar42);
        auVar36 = vmaxps_avx(auVar38,auVar36);
        auVar37 = vminps_avx512vl(auVar33,auVar37);
        auVar35 = vminps_avx(auVar37,auVar35);
        auVar37._8_4_ = 0x3f7ffffa;
        auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
        auVar37._12_4_ = 0x3f7ffffa;
        auVar37 = vmulps_avx512vl(auVar36,auVar37);
        auVar36._8_4_ = 0x3f800003;
        auVar36._0_8_ = 0x3f8000033f800003;
        auVar36._12_4_ = 0x3f800003;
        auVar36 = vmulps_avx512vl(auVar35,auVar36);
        uVar8 = vcmpps_avx512vl(auVar37,auVar36,2);
        uVar22 = (uint)uVar8;
      }
      else {
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar17),auVar47,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar17));
        auVar36 = vsubps_avx(auVar36,auVar62);
        auVar35 = vmulps_avx512vl(auVar26,auVar36);
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar21),auVar47,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar21));
        auVar36 = vsubps_avx512vl(auVar36,auVar24);
        auVar37 = vmulps_avx512vl(auVar27,auVar36);
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar18),auVar47,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar18));
        auVar36 = vsubps_avx512vl(auVar36,auVar25);
        auVar36 = vmulps_avx512vl(auVar28,auVar36);
        auVar36 = vmaxps_avx(auVar37,auVar36);
        auVar35 = vmaxps_avx512vl(auVar32,auVar35);
        auVar36 = vmaxps_avx(auVar35,auVar36);
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + (uVar17 ^ 0x10)),auVar47,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + (uVar17 ^ 0x10)));
        auVar35 = vsubps_avx(auVar35,auVar62);
        auVar37 = vmulps_avx512vl(auVar29,auVar35);
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + (uVar21 ^ 0x10)),auVar47,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + (uVar21 ^ 0x10)));
        auVar35 = vsubps_avx512vl(auVar35,auVar24);
        auVar38 = vmulps_avx512vl(auVar30,auVar35);
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + (uVar18 ^ 0x10)),auVar47,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + (uVar18 ^ 0x10)));
        auVar35 = vsubps_avx512vl(auVar35,auVar25);
        auVar35 = vmulps_avx512vl(auVar31,auVar35);
        auVar35 = vminps_avx(auVar38,auVar35);
        auVar37 = vminps_avx512vl(auVar33,auVar37);
        auVar35 = vminps_avx(auVar37,auVar35);
        uVar8 = vcmpps_avx512vl(auVar36,auVar35,2);
        uVar22 = (uint)uVar8;
        if (uVar14 == 6) {
          uVar9 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
          uVar10 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(uVar13 + 0xe0),0xd);
          uVar22 = (uint)(byte)((byte)uVar9 & (byte)uVar10 & (byte)uVar8);
        }
      }
      if ((byte)uVar22 == 0) goto LAB_01cdfe5a;
      lVar11 = 0;
      for (uVar16 = (ulong)(byte)uVar22; (uVar16 & 1) == 0;
          uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar16 = *(ulong *)(uVar13 + lVar11 * 8);
      uVar14 = (uVar22 & 0xff) - 1 & uVar22 & 0xff;
      uVar15 = (ulong)uVar14;
    } while (uVar14 == 0);
    do {
      *puVar20 = uVar16;
      puVar20 = puVar20 + 1;
      lVar11 = 0;
      for (uVar16 = uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar15 = uVar15 - 1 & uVar15;
      uVar16 = *(ulong *)(uVar13 + lVar11 * 8);
    } while (uVar15 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }